

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtemporaryfile.cpp
# Opt level: O0

QString * __thiscall QTemporaryFile::fileName(QTemporaryFile *this)

{
  bool bVar1;
  int iVar2;
  QTemporaryFilePrivate *pQVar3;
  pointer pQVar4;
  undefined4 extraout_var;
  QTemporaryFilePrivate *in_RDI;
  QTemporaryFileEngine *tef;
  QTemporaryFilePrivate *d;
  QTemporaryFileEngine *in_stack_ffffffffffffffc8;
  QTemporaryFilePrivate *this_00;
  
  this_00 = in_RDI;
  pQVar3 = d_func((QTemporaryFile *)0x2f9969);
  pQVar4 = std::unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>::get
                     ((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_> *)
                      this_00);
  if ((pQVar4 != (pointer)0x0) &&
     (bVar1 = QTemporaryFileEngine::isReallyOpen(in_stack_ffffffffffffffc8), bVar1)) {
    QTemporaryFilePrivate::materializeUnnamedFile(this_00);
  }
  bVar1 = QString::isEmpty((QString *)0x2f99b7);
  if (bVar1) {
    QString::QString((QString *)0x2f99c7);
  }
  else {
    iVar2 = (*(pQVar3->super_QFilePrivate).super_QFileDevicePrivate.super_QIODevicePrivate.
              super_QObjectPrivate.super_QObjectData._vptr_QObjectData[7])();
    (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 200))
              (this_00,(long *)CONCAT44(extraout_var,iVar2),0);
  }
  return (QString *)in_RDI;
}

Assistant:

QString QTemporaryFile::fileName() const
{
    Q_D(const QTemporaryFile);
    auto tef = static_cast<QTemporaryFileEngine *>(d->fileEngine.get());
    if (tef && tef->isReallyOpen())
        const_cast<QTemporaryFilePrivate *>(d)->materializeUnnamedFile();

    if (d->fileName.isEmpty())
        return QString();
    return d->engine()->fileName(QAbstractFileEngine::DefaultName);
}